

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O0

void __thiscall hmac_hash::SHA512::transform(SHA512 *this,uint8_t *message,size_t block_nb)

{
  long lVar1;
  ulong local_310;
  size_t j;
  size_t i;
  uint8_t *sub_block;
  uint64_t t2;
  uint64_t t1;
  uint64_t wv [8];
  uint64_t w [80];
  size_t block_nb_local;
  uint8_t *message_local;
  SHA512 *this_local;
  
  for (j = 0; j < block_nb; j = j + 1) {
    for (local_310 = 0; local_310 < 0x10; local_310 = local_310 + 1) {
      wv[local_310 + 7] =
           CONCAT17(message[local_310 * 8 + j * 0x80],
                    CONCAT16(message[local_310 * 8 + j * 0x80 + 1],
                             CONCAT15(message[local_310 * 8 + j * 0x80 + 2],
                                      CONCAT14(message[local_310 * 8 + j * 0x80 + 3],
                                               CONCAT13(message[local_310 * 8 + j * 0x80 + 4],
                                                        CONCAT12(message[local_310 * 8 +
                                                                         j * 0x80 + 5],
                                                                 CONCAT11(message[local_310 * 8 +
                                                                                  j * 0x80 + 6],
                                                                          message[local_310 * 8 +
                                                                                  j * 0x80 + 7])))))
                            ));
    }
    for (local_310 = 0x10; local_310 < 0x50; local_310 = local_310 + 1) {
      wv[local_310 + 7] =
           ((wv[local_310 + 5] >> 0x13 | wv[local_310 + 5] << 0x2d) ^
            (wv[local_310 + 5] >> 0x3d | wv[local_310 + 5] << 3) ^ wv[local_310 + 5] >> 6) +
           wv[local_310] +
           ((wv[local_310 - 8] >> 1 | wv[local_310 - 8] << 0x3f) ^
            (wv[local_310 - 8] >> 8 | wv[local_310 - 8] << 0x38) ^ wv[local_310 - 8] >> 7) +
           wv[local_310 - 9];
    }
    for (local_310 = 0; local_310 < 8; local_310 = local_310 + 1) {
      wv[local_310 - 1] = this->m_h[local_310];
    }
    for (local_310 = 0; local_310 < 0x50; local_310 = local_310 + 1) {
      lVar1 = wv[6] + ((wv[3] >> 0xe | wv[3] << 0x32) ^ (wv[3] >> 0x12 | wv[3] << 0x2e) ^
                      (wv[3] >> 0x29 | wv[3] << 0x17)) +
              (wv[3] & wv[4] ^ (wv[3] ^ 0xffffffffffffffff) & wv[5]) +
              *(long *)(sha512_k + local_310 * 8) + wv[local_310 + 7];
      wv[6] = wv[5];
      wv[5] = wv[4];
      wv[4] = wv[3];
      wv[3] = wv[2] + lVar1;
      wv[2] = wv[1];
      wv[1] = wv[0];
      wv[0] = t1;
      t1 = lVar1 + ((t1 >> 0x1c | t1 << 0x24) ^ (t1 >> 0x22 | t1 << 0x1e) ^
                   (t1 >> 0x27 | t1 << 0x19)) + (t1 & wv[0] ^ t1 & wv[1] ^ wv[0] & wv[1]);
    }
    for (local_310 = 0; local_310 < 8; local_310 = local_310 + 1) {
      this->m_h[local_310] = wv[local_310 - 1] + this->m_h[local_310];
    }
  }
  return;
}

Assistant:

void SHA512::transform(const uint8_t *message, size_t block_nb) {
        uint64_t w[80];
        uint64_t wv[8];
        uint64_t t1, t2;
        const uint8_t *sub_block;
        size_t i, j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 7);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK64(&sub_block[j << 3], &w[j]);
            }
            for(j = 16; j < 80; ++j) {
                w[j] =  SHA512_F4(w[j -  2]) + w[j -  7] + SHA512_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 80; ++j) {
                t1 = wv[7] + SHA512_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha512_k[j] + w[j];
                t2 = SHA512_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }